

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O1

bool QCoreApplicationPrivate::isTranslatorInstalled(QTranslator *translator)

{
  long lVar1;
  QObjectData *pQVar2;
  long lVar3;
  long in_RCX;
  QObject **this;
  long lVar4;
  
  if (QCoreApplication::self == (QCoreApplication *)0x0) {
    return false;
  }
  pQVar2 = (QCoreApplication::self->super_QObject).d_ptr.d;
  this = &pQVar2[2].parent;
  if (((ulong)this & 1) == 0) {
    QReadWriteLock::lockForRead((QReadWriteLock *)this);
    this = (QObject **)((ulong)this | 1);
  }
  if (pQVar2[2].q_ptr != (QObject *)0x0) {
    lVar4 = -8;
    do {
      lVar1 = (long)pQVar2[2].q_ptr * -8 + lVar4;
      if (lVar1 == -8) goto LAB_0027a19e;
      in_RCX = lVar4 + 8;
      lVar3 = lVar4 + 8;
      lVar4 = in_RCX;
    } while (*(QTranslator **)((long)pQVar2[2]._vptr_QObjectData + lVar3) != translator);
    in_RCX = in_RCX >> 3;
LAB_0027a19e:
    if (lVar1 != -8) goto LAB_0027a1ab;
  }
  in_RCX = -1;
LAB_0027a1ab:
  if (((ulong)this & 1) != 0) {
    QReadWriteLock::unlock((QReadWriteLock *)((ulong)this & 0xfffffffffffffffe));
  }
  return in_RCX != -1;
}

Assistant:

bool QCoreApplicationPrivate::isTranslatorInstalled(QTranslator *translator)
{
    if (!QCoreApplication::self)
        return false;
    QCoreApplicationPrivate *d = QCoreApplication::self->d_func();
    QReadLocker locker(&d->translateMutex);
    return d->translators.contains(translator);
}